

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

void play_speaker(tgestate_t *state,sound_t sound)

{
  byte bVar1;
  sound_t sVar2;
  byte bVar3;
  uint uVar4;
  
  uVar4 = sound >> 8;
  bVar1 = 0x10;
  do {
    (*state->speccy->out)(state->speccy,0xfe,bVar1);
    for (sVar2 = sound & 0xff; sVar2 != 0; sVar2 = sVar2 - 1) {
      (*state->speccy->out)(state->speccy,0xfe,bVar1);
    }
    bVar1 = bVar1 ^ 0x10;
    bVar3 = (char)uVar4 - 1;
    uVar4 = (uint)bVar3;
  } while (bVar3 != 0);
  return;
}

Assistant:

void play_speaker(tgestate_t *state, sound_t sound)
{
  uint8_t iters;      /* was B */
  uint8_t delay;      /* was A */
  uint8_t speakerbit; /* was A */
//  uint8_t subcount;   /* was C */

  assert(state != NULL);
  // assert(sound); somehow

  iters = sound >> 8;
  delay = sound & 0xFF;

  speakerbit = port_MASK_EAR; /* Initial speaker bit. */
  do
  {
    state->speccy->out(state->speccy, port_BORDER_EAR_MIC, speakerbit); /* Play. */

    /* Conv: Timing: The original game uses an empty delay loop here to
     * maintain the currently output speaker bit. Instead of that, since our
     * sound code has no knowledge of time, we just output the speaker bit
     * for the delay period. */
    {
      int i;

      for (i = 0; i < delay; i++)
        state->speccy->out(state->speccy, port_BORDER_EAR_MIC, speakerbit);;
    }

    speakerbit ^= port_MASK_EAR; /* Toggle speaker bit. */
  }
  while (--iters);
}